

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::set_bytesvalue
          (CustomModel_CustomModelParamValue *this,string *value)

{
  if (this->_oneof_case_[0] != 0x3c) {
    clear_value(this);
    this->_oneof_case_[0] = 0x3c;
    (this->value_).doublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->value_).stringvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void CustomModel_CustomModelParamValue::set_bytesvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomModel.CustomModelParamValue.bytesValue)
  if (!has_bytesvalue()) {
    clear_value();
    set_has_bytesvalue();
    value_.bytesvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  value_.bytesvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.CustomModel.CustomModelParamValue.bytesValue)
}